

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::TestCase::reportable_disabled_test_count(TestCase *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  TestCase *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = internal::
          CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
                    (&this->test_info_list_,TestReportableDisabled);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int TestCase::reportable_disabled_test_count() const {
  return CountIf(test_info_list_, TestReportableDisabled);
}